

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

find_result __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::find_child(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
             *this,byte key_byte)

{
  uint uVar1;
  uint uVar2;
  in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *piVar3;
  undefined1 auVar4 [16];
  find_result fVar5;
  
  auVar4[1] = key_byte;
  auVar4[0] = key_byte;
  auVar4[2] = key_byte;
  auVar4[3] = key_byte;
  auVar4[4] = key_byte;
  auVar4[5] = key_byte;
  auVar4[6] = key_byte;
  auVar4[7] = key_byte;
  auVar4[8] = key_byte;
  auVar4[9] = key_byte;
  auVar4[10] = key_byte;
  auVar4[0xb] = key_byte;
  auVar4[0xc] = key_byte;
  auVar4[0xd] = key_byte;
  auVar4[0xe] = key_byte;
  auVar4[0xf] = key_byte;
  auVar4 = vpcmpeqb_avx(auVar4,ZEXT416((uint)this->keys));
  uVar2 = (uint)(ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) & ~(-1 << (this->field_0x8 & 0x1f))
  ;
  uVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  fVar5.first = (byte)-(uint)(uVar2 == 0) | (byte)uVar1;
  fVar5._1_3_ = (int3)(-(uint)(uVar2 == 0) >> 8);
  fVar5._4_4_ = 0;
  piVar3 = (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_> *)
           0x0;
  if (uVar2 != 0) {
    piVar3 = (this->children)._M_elems + uVar1;
  }
  fVar5.second = piVar3;
  return fVar5;
}

Assistant:

[[nodiscard, gnu::pure]] find_result find_child(std::byte key_byte) noexcept {
#ifdef UNODB_DETAIL_X86_64
    const auto replicated_search_key =
        _mm_set1_epi8(static_cast<char>(key_byte));
    const auto keys_in_sse_reg =
        _mm_cvtsi32_si128(static_cast<std::int32_t>(keys.integer.load()));
    const auto matching_key_positions =
        _mm_cmpeq_epi8(replicated_search_key, keys_in_sse_reg);
    const auto mask = (1U << this->children_count.load()) - 1;
    const auto bit_field =
        static_cast<unsigned>(_mm_movemask_epi8(matching_key_positions)) & mask;
    if (bit_field != 0) {
      const auto i = detail::ctz(bit_field);
      return std::make_pair(
          i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
    }
    return parent_class::child_not_found;
#elif defined(__aarch64__)
    const auto replicated_search_key =
        vdupq_n_u8(static_cast<std::uint8_t>(key_byte));
    const auto keys_in_neon_reg = vreinterpretq_u8_u32(
        // NOLINTNEXTLINE(misc-const-correctness)
        vsetq_lane_u32(keys.integer.load(), vdupq_n_u32(0), 0));
    const auto mask = (1ULL << (this->children_count.load() << 3U)) - 1;
    const auto matching_key_positions =
        vceqq_u8(replicated_search_key, keys_in_neon_reg);
    const auto u64_pos_in_vec =
        vget_low_u64(vreinterpretq_u64_u8(matching_key_positions));
    // NOLINTNEXTLINE(misc-const-correctness)
    const auto pos_in_scalar = vget_lane_u64(u64_pos_in_vec, 0);
    const auto masked_pos = pos_in_scalar & mask;

    if (masked_pos == 0) return parent_class::child_not_found;

    const auto i = static_cast<unsigned>(detail::ctz(masked_pos) >> 3U);
    return std::make_pair(
        i, static_cast<critical_section_policy<node_ptr> *>(&children[i]));
#else   // #ifdef UNODB_DETAIL_X86_64
    // Bit twiddling:
    // contains_byte:     __builtin_ffs:   for key index:
    //    0x80000000               0x20                3
    //      0x800000               0x18                2
    //      0x808000               0x10                1
    //          0x80                0x8                0
    //           0x0                0x0        not found
    const auto result =
        static_cast<typename decltype(keys.byte_array)::size_type>(
            // __builtin_ffs takes signed argument:
            // NOLINTNEXTLINE(hicpp-signed-bitwise)
            __builtin_ffs(static_cast<std::int32_t>(
                contains_byte(keys.integer, key_byte))) >>
            3);

    // The second condition could be replaced with masking, but this seems to
    // result in a benchmark regression
    if ((result == 0) || (result > this->children_count.load()))
      return parent_class::child_not_found;

    return std::make_pair(result - 1,
                          static_cast<critical_section_policy<node_ptr> *>(
                              &children[result - 1]));
#endif  // #ifdef UNODB_DETAIL_X86_64
  }